

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::StrPair::ParseName(StrPair *this,char *p)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  char *pcVar5;
  
  if ((p == (char *)0x0) || (bVar4 = *p, bVar4 == 0)) {
LAB_0010561a:
    pcVar5 = (char *)0x0;
  }
  else {
    if (-1 < (char)bVar4) {
      uVar3 = (uint)bVar4;
      iVar2 = isalpha(uVar3);
      if (((iVar2 == 0) && (uVar3 != 0x5f)) && (uVar3 != 0x3a)) goto LAB_0010561a;
    }
    pcVar5 = p + 1;
    bVar4 = p[1];
    while (bVar4 != 0) {
      if (-1 < (char)bVar4) {
        iVar2 = isalpha((uint)bVar4);
        if (((iVar2 == 0) && (bVar4 != 0x3a)) &&
           ((bVar4 != 0x5f && (1 < (byte)(bVar4 - 0x2d) && 9 < bVar4 - 0x30)))) break;
      }
      pbVar1 = (byte *)(pcVar5 + 1);
      pcVar5 = pcVar5 + 1;
      bVar4 = *pbVar1;
    }
    if (((this->_flags & 0x200) != 0) && (this->_start != (char *)0x0)) {
      operator_delete__(this->_start);
    }
    this->_start = (char *)0x0;
    this->_end = (char *)0x0;
    this->_start = p;
    this->_end = pcVar5;
    this->_flags = 0x100;
  }
  return pcVar5;
}

Assistant:

char* StrPair::ParseName( char* p )
{
    if ( !p || !(*p) ) {
        return 0;
    }
    if ( !XMLUtil::IsNameStartChar( *p ) ) {
        return 0;
    }

    char* const start = p;
    ++p;
    while ( *p && XMLUtil::IsNameChar( *p ) ) {
        ++p;
    }

    Set( start, p, 0 );
    return p;
}